

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_priority_change_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  int iVar2;
  char *pcVar3;
  string local_30;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar3 = "fail";
      if (resp->accepted_ != false) {
        pcVar3 = "success";
      }
      msg_if_given_abi_cxx11_
                (&local_30,"got response from peer %d: %s",(ulong)(uint)(resp->super_msg_base).src_,
                 pcVar3);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                 ,"handle_priority_change_resp",0xcb,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return;
}

Assistant:

void raft_server::handle_priority_change_resp(resp_msg& resp) {
    p_in("got response from peer %d: %s",
         resp.get_src(),
         resp.get_accepted() ? "success" : "fail");
}